

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_post.c
# Opt level: O1

int post_form(FORM *form)

{
  short sVar1;
  undefined2 uVar2;
  int iVar3;
  WINDOW_conflict *pWVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  
  if (form == (FORM *)0x0) {
    iVar3 = -2;
  }
  else {
    iVar3 = -3;
    if ((form->status & 1) == 0) {
      if (form->field == (FIELD **)0x0) {
        iVar3 = -0xb;
      }
      else {
        pWVar4 = form->sub;
        if ((form->sub == (WINDOW_conflict *)0x0) &&
           (pWVar4 = form->win, form->win == (WINDOW_conflict *)0x0)) {
          pWVar4 = _stdscr;
        }
        iVar7 = -1;
        iVar6 = -1;
        if (pWVar4 != (WINDOW_conflict *)0x0) {
          iVar6 = pWVar4->_maxy + 1;
          iVar7 = pWVar4->_maxx + 1;
        }
        iVar3 = -6;
        if ((form->cols <= iVar7) && (form->rows <= iVar6)) {
          sVar1 = form->curpage;
          form->curpage = -1;
          iVar3 = _nc_Set_Form_Page(form,(int)sVar1,form->current);
          if (iVar3 == 0) {
            uVar2 = form->status;
            form->status = uVar2 | 1;
            if (form->forminit != (_func_void_formnode_ptr *)0x0) {
              form->status = uVar2 | 3;
              (*form->forminit)(form);
              *(byte *)&form->status = (byte)form->status & 0xfd;
            }
            if (form->fieldinit != (_func_void_formnode_ptr *)0x0) {
              *(byte *)&form->status = (byte)form->status | 2;
              (*form->fieldinit)(form);
              *(byte *)&form->status = (byte)form->status & 0xfd;
            }
            _nc_Refresh_Current_Field(form);
            iVar3 = 0;
          }
        }
      }
    }
  }
  piVar5 = __errno_location();
  *piVar5 = iVar3;
  return iVar3;
}

Assistant:

int post_form(FORM * form)
{
  WINDOW *formwin;
  int err;
  int page;
  int height, width;

  if (!form)
    RETURN(E_BAD_ARGUMENT);

  if (form->status & _POSTED)   
    RETURN(E_POSTED);

  if (!(form->field))
    RETURN(E_NOT_CONNECTED);
  
  formwin = Get_Form_Window(form);
  getmaxyx(formwin, height, width);
  if ((form->cols > width) || (form->rows > height))
    RETURN(E_NO_ROOM);

  /* reset form->curpage to an invalid value. This forces Set_Form_Page
     to do the page initialization which is required by post_form.
  */
  page = form->curpage;
  form->curpage = -1;
  if ((err = _nc_Set_Form_Page(form,page,form->current))!=E_OK)
    RETURN(err);

  form->status |= _POSTED;

  Call_Hook(form,forminit);
  Call_Hook(form,fieldinit);

  _nc_Refresh_Current_Field(form);
  RETURN(E_OK);
}